

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateGLImpl::
PipelineBuilder<Diligent::ComputePipelineStateCreateInfo,_Diligent::ComputePipelineStateCreateInfoX>
::HandleLinkingPrograms
          (PipelineBuilder<Diligent::ComputePipelineStateCreateInfo,_Diligent::ComputePipelineStateCreateInfoX>
           *this,bool WaitForCompletion)

{
  SHADER_TYPE ShaderType;
  pointer ppSVar1;
  PSO_CREATE_INTERNAL_FLAGS *pPVar2;
  LinkStatus LVar3;
  RenderDeviceGLImpl *pRVar4;
  ostream *poVar5;
  char (*in_RCX) [34];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  SHADER_TYPE ActiveStages;
  PSO_CREATE_INTERNAL_FLAGS InternalFlags;
  PipelineStateGLImpl *this_00;
  char (*in_R8) [19];
  long lVar6;
  pointer ppSVar7;
  long lVar8;
  size_t i;
  ulong uVar9;
  string _msg;
  Diligent local_1c8 [32];
  string msg;
  
  if ((this->super_PipelineBuilderBase).m_State != LinkingPrograms) {
    FormatString<char[26],char[34]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State == State::LinkingPrograms",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"HandleLinkingPrograms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x177);
    std::__cxx11::string::~string((string *)&msg);
  }
  ppSVar1 = (this->super_PipelineBuilderBase).m_Shaders.
            super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ActiveStages = SHADER_TYPE_UNKNOWN;
  for (ppSVar7 = (this->super_PipelineBuilderBase).m_Shaders.
                 super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar7 != ppSVar1;
      ppSVar7 = ppSVar7 + 1) {
    ShaderType = ((*ppSVar7)->super_ShaderBase<Diligent::EngineGLImplTraits>).
                 super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                 .m_Desc.ShaderType;
    if ((ShaderType & ActiveStages) != SHADER_TYPE_UNKNOWN) {
      _msg._M_dataplus._M_p = GetShaderTypeLiteralName(ShaderType);
      FormatString<char[14],char_const*,char[19]>
                (&msg,(Diligent *)"Shader stage ",(char (*) [14])&_msg,(char **)" is already active"
                 ,in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"HandleLinkingPrograms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                 ,0x17e);
      std::__cxx11::string::~string((string *)&msg);
    }
    ActiveStages = ActiveStages | ShaderType;
  }
  this_00 = (this->super_PipelineBuilderBase).m_Pipeline;
  if (this_00->m_IsProgramPipelineSupported == true) {
    lVar6 = 0;
    lVar8 = 0;
    for (uVar9 = 0;
        ppSVar7 = (this->super_PipelineBuilderBase).m_Shaders.
                  super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)(this->super_PipelineBuilderBase).m_Shaders.
                              super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7 >> 3);
        uVar9 = uVar9 + 1) {
      if (*(long *)((long)&(this_00->m_GLPrograms->
                           super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar8 * 2) == 0) {
        msg._M_dataplus._M_p = (pointer)((long)ppSVar7 + lVar8);
        msg._M_string_length._0_4_ = 1;
        msg._M_string_length._4_1_ = 1;
        msg.field_2._M_allocated_capacity = (size_type)(PipelineResourceLayoutDesc *)0x0;
        if ((this->m_CreateInfo).
            super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
            .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.
            ResourceSignaturesCount == 0) {
          msg.field_2._M_allocated_capacity =
               (size_type)
               &(this->m_CreateInfo).
                super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
                .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.
                ResourceLayout;
        }
        msg.field_2._8_8_ =
             (this->m_CreateInfo).
             super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
             .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.
             ppResourceSignatures;
        pRVar4 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                 ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                              *)this_00);
        GLProgramCache::GetProgram
                  ((GLProgramCache *)&_msg,(GetProgramAttribs *)&pRVar4->m_ProgramCache);
        std::__shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(((this->super_PipelineBuilderBase).m_Pipeline)->m_GLPrograms->
                           super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar6),
                   (__shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2> *)&_msg);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_msg._M_string_length);
        this_00 = (this->super_PipelineBuilderBase).m_Pipeline;
        this_00->m_ShaderTypes[uVar9] =
             *(SHADER_TYPE *)
              (*(long *)((long)(this->super_PipelineBuilderBase).m_Shaders.
                               super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar8) + 0x20);
      }
      lVar8 = lVar8 + 8;
      lVar6 = lVar6 + 0x10;
    }
  }
  else if ((this_00->m_GLPrograms->
           super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
           (element_type *)0x0) {
    msg._M_dataplus._M_p =
         (pointer)(this->super_PipelineBuilderBase).m_Shaders.
                  super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    msg._M_string_length._0_4_ =
         (undefined4)
         ((ulong)((long)(this->super_PipelineBuilderBase).m_Shaders.
                        super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)msg._M_dataplus._M_p) >>
         3);
    msg._M_string_length._4_1_ = 0;
    msg.field_2._M_allocated_capacity = (size_type)(PipelineResourceLayoutDesc *)0x0;
    if ((this->m_CreateInfo).
        super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
        .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.ResourceSignaturesCount
        == 0) {
      msg.field_2._M_allocated_capacity =
           (size_type)
           &(this->m_CreateInfo).
            super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
            .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.
            ResourceLayout;
    }
    msg.field_2._8_8_ =
         (this->m_CreateInfo).
         super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
         .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.ppResourceSignatures;
    pRVar4 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
             ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                          *)this_00);
    GLProgramCache::GetProgram((GLProgramCache *)&_msg,(GetProgramAttribs *)&pRVar4->m_ProgramCache)
    ;
    std::__shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((this->super_PipelineBuilderBase).m_Pipeline)->m_GLPrograms->
                super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2> *)&_msg);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_msg._M_string_length);
    this_00 = (this->super_PipelineBuilderBase).m_Pipeline;
    *this_00->m_ShaderTypes = ActiveStages;
  }
  lVar6 = 0;
  uVar9 = 0;
  while( true ) {
    if (this_00->m_NumPrograms <= uVar9) {
      pPVar2 = (PSO_CREATE_INTERNAL_FLAGS *)
               (this->m_CreateInfo).
               super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
               .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.pInternalData;
      if (pPVar2 == (PSO_CREATE_INTERNAL_FLAGS *)0x0) {
        InternalFlags = PSO_CREATE_INTERNAL_FLAG_NONE;
      }
      else {
        InternalFlags = *pPVar2;
      }
      InitResourceLayout(this_00,InternalFlags,&(this->super_PipelineBuilderBase).m_Shaders,
                         ActiveStages);
      (this->super_PipelineBuilderBase).m_State = Complete;
      return;
    }
    LVar3 = GLProgram::GetLinkStatus
                      (*(GLProgram **)
                        ((long)&(this_00->m_GLPrograms->
                                super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr + lVar6),WaitForCompletion);
    if (LVar3 == InProgress) break;
    if (LVar3 == Failed) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      poVar5 = std::operator<<((ostream *)&msg,"Failed to link program ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," for pipeline state \'");
      poVar5 = std::operator<<(poVar5,(((this->super_PipelineBuilderBase).m_Pipeline)->
                                      super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                                      super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                                      .m_Desc.super_DeviceObjectAttribs.Name);
      poVar5 = std::operator<<(poVar5,"\': ");
      std::operator<<(poVar5,(string *)
                             (*(long *)((long)&(((this->super_PipelineBuilderBase).m_Pipeline)->
                                                m_GLPrograms->
                                               super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr + lVar6) + 0x28));
      if ((this->super_PipelineBuilderBase).m_CreateAsynchronously == true) {
        std::__cxx11::stringbuf::str();
        FormatString<std::__cxx11::string>(&_msg,local_1c8,Args);
        std::__cxx11::string::~string((string *)local_1c8);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
        }
      }
      else {
        std::__cxx11::stringbuf::str();
        LogError<true,std::__cxx11::string>
                  (false,"HandleLinkingPrograms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                   ,0x1bb,&_msg);
      }
      std::__cxx11::string::~string((string *)&_msg);
      (this->super_PipelineBuilderBase).m_State = Failed;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
      return;
    }
    uVar9 = uVar9 + 1;
    this_00 = (this->super_PipelineBuilderBase).m_Pipeline;
    lVar6 = lVar6 + 0x10;
  }
  return;
}

Assistant:

void HandleLinkingPrograms(bool WaitForCompletion)
    {
        VERIFY_EXPR(m_State == State::LinkingPrograms);

        // Get active shader stages
        SHADER_TYPE ActiveStages = SHADER_TYPE_UNKNOWN;
        for (const ShaderGLImpl* pShaderGL : m_Shaders)
        {
            const auto ShaderType = pShaderGL->GetDesc().ShaderType;
            VERIFY((ActiveStages & ShaderType) == 0, "Shader stage ", GetShaderTypeLiteralName(ShaderType), " is already active");
            ActiveStages |= ShaderType;
        }

        // Create programs

        // Linking programs may be epxensive, so we cache programs keyed by shader IDs and resource signature IDs or resource layout.
        if (m_Pipeline.m_IsProgramPipelineSupported)
        {
            for (size_t i = 0; i < m_Shaders.size(); ++i)
            {
                if (!m_Pipeline.m_GLPrograms[i])
                {
                    GLProgramCache::GetProgramAttribs ProgAttribs{
                        &m_Shaders[i],
                        1,
                        true, // IsSeparableProgram
                        m_CreateInfo.ResourceSignaturesCount == 0 ? &m_CreateInfo.PSODesc.ResourceLayout : nullptr,
                        m_CreateInfo.ppResourceSignatures,
                        m_CreateInfo.ResourceSignaturesCount,
                    };
                    m_Pipeline.m_GLPrograms[i]  = m_Pipeline.GetDevice()->GetProgramCache().GetProgram(ProgAttribs);
                    m_Pipeline.m_ShaderTypes[i] = m_Shaders[i]->GetDesc().ShaderType;
                }
            }
        }
        else
        {
            if (!m_Pipeline.m_GLPrograms[0])
            {
                GLProgramCache::GetProgramAttribs ProgAttribs{
                    m_Shaders.data(),
                    static_cast<Uint32>(m_Shaders.size()),
                    false, // IsSeparableProgram
                    m_CreateInfo.ResourceSignaturesCount == 0 ? &m_CreateInfo.PSODesc.ResourceLayout : nullptr,
                    m_CreateInfo.ppResourceSignatures,
                    m_CreateInfo.ResourceSignaturesCount,
                };
                m_Pipeline.m_GLPrograms[0]  = m_Pipeline.GetDevice()->GetProgramCache().GetProgram(ProgAttribs);
                m_Pipeline.m_ShaderTypes[0] = ActiveStages;
            }
        }

        // Check program linking status
        for (Uint32 i = 0; i < m_Pipeline.m_NumPrograms; ++i)
        {
            GLProgram::LinkStatus LinkStatus = m_Pipeline.m_GLPrograms[i]->GetLinkStatus(WaitForCompletion);
            if (LinkStatus == GLProgram::LinkStatus::InProgress)
            {
                return;
            }
            else if (LinkStatus == GLProgram::LinkStatus::Failed)
            {
                std::ostringstream ss;
                ss << "Failed to link program " << i << " for pipeline state '" << m_Pipeline.m_Desc.Name << "': " << m_Pipeline.m_GLPrograms[i]->GetInfoLog();
                if (m_CreateAsynchronously)
                {
                    LOG_ERROR_MESSAGE(ss.str());
                }
                else
                {
                    LOG_ERROR_AND_THROW(ss.str());
                }
                m_State = State::Failed;
                return;
            }
        }

        m_Pipeline.InitResourceLayout(GetInternalCreateFlags(m_CreateInfo), m_Shaders, ActiveStages);
        m_State = State::Complete;
    }